

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

bool __thiscall ON_BezierCurve::IncreaseDegree(ON_BezierCurve *this,int desired_degree)

{
  bool bVar1;
  bool local_15;
  bool rc;
  int desired_degree_local;
  ON_BezierCurve *this_local;
  
  local_15 = false;
  if (0 < desired_degree) {
    if (desired_degree == this->m_order + -1) {
      local_15 = true;
    }
    else if (this->m_order <= desired_degree) {
      ReserveCVCapacity(this,this->m_cv_stride * (desired_degree + 1));
      while (this->m_order <= desired_degree) {
        bVar1 = ON_IncreaseBezierDegree
                          (this->m_dim,this->m_is_rat != 0,this->m_order,this->m_cv_stride,
                           this->m_cv);
        local_15 = (bool)(-bVar1 & 1);
        if (local_15 == false) {
          return false;
        }
        this->m_order = this->m_order + 1;
      }
    }
  }
  return local_15;
}

Assistant:

bool ON_BezierCurve::IncreaseDegree( int desired_degree )
{
  bool rc = false;
  if ( desired_degree > 0 ) {
    if ( desired_degree == m_order-1 )
      rc = true;
    else if ( desired_degree >= m_order ) {
      ReserveCVCapacity( m_cv_stride*(desired_degree+1) );
      while ( m_order <= desired_degree ) {
        rc = ON_IncreaseBezierDegree( m_dim, m_is_rat, m_order, m_cv_stride, m_cv )?true:false;
        if ( !rc )
          break;
        m_order++;
      }
    }
  }
  return rc;
}